

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *args_4;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *args_6;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *args_8;
  ConfigDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor;
  Token local_90;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  args_4 = deepClone<slang::syntax::ParameterDeclarationStatementSyntax>
                     ((SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)
                      (__fn + 0x80),(BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0xb8),(BumpAllocator *)__child_stack);
  args_6 = deepClone<slang::syntax::ConfigCellIdentifierSyntax>
                     ((SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)(__fn + 200),
                      (BumpAllocator *)__child_stack);
  local_80 = parsing::Token::deepClone((Token *)(__fn + 0x100),(BumpAllocator *)__child_stack);
  args_8 = deepClone<slang::syntax::ConfigRuleSyntax>
                     ((SyntaxList<slang::syntax::ConfigRuleSyntax> *)(__fn + 0x110),
                      (BumpAllocator *)__child_stack);
  local_90 = parsing::Token::deepClone((Token *)(__fn + 0x148),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x158) == (SyntaxNode *)0x0) {
    _visitor = (SyntaxNode *)0x0;
  }
  else {
    _visitor = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x158),&visitor,(BumpAllocator *)__child_stack);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConfigDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_40,&local_50,&local_60,args_4,
                      &local_70,args_6,&local_80,args_8,&local_90,
                      (NamedBlockClauseSyntax **)&visitor);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConfigDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConfigDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.config.deepClone(alloc),
        node.name.deepClone(alloc),
        node.semi1.deepClone(alloc),
        *deepClone(node.localparams, alloc),
        node.design.deepClone(alloc),
        *deepClone(node.topCells, alloc),
        node.semi2.deepClone(alloc),
        *deepClone(node.rules, alloc),
        node.endconfig.deepClone(alloc),
        node.blockName ? deepClone(*node.blockName, alloc) : nullptr
    );
}